

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Boolean mandatoryChild(UA_Server *server,UA_Session *session,UA_NodeId *childNodeId)

{
  UA_Boolean UVar1;
  UA_Node *pUVar2;
  UA_ReferenceNode *n2;
  UA_ReferenceNode *ref;
  size_t i;
  UA_Node *child;
  UA_NodeId hasModellingRuleId;
  UA_NodeId mandatoryId;
  UA_NodeId *childNodeId_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  UA_NODEID_NUMERIC((UA_NodeId *)((long)&hasModellingRuleId.identifier + 8),0,0x4e);
  UA_NODEID_NUMERIC((UA_NodeId *)&child,0,0x25);
  pUVar2 = UA_NodeStore_get(server->nodestore,childNodeId);
  if (pUVar2 != (UA_Node *)0x0) {
    for (ref = (UA_ReferenceNode *)0x0; ref < (UA_ReferenceNode *)pUVar2->referencesSize;
        ref = (UA_ReferenceNode *)((long)&(ref->referenceTypeId).namespaceIndex + 1)) {
      n2 = pUVar2->references + (long)ref;
      UVar1 = UA_NodeId_equal((UA_NodeId *)&child,&n2->referenceTypeId);
      if (((UVar1) &&
          (UVar1 = UA_NodeId_equal((UA_NodeId *)((long)&hasModellingRuleId.identifier + 8),
                                   &(n2->targetId).nodeId), UVar1)) && ((n2->isInverse & 1U) == 0))
      {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static UA_Boolean
mandatoryChild(UA_Server *server, UA_Session *session, const UA_NodeId *childNodeId) {
    const UA_NodeId mandatoryId = UA_NODEID_NUMERIC(0, UA_NS0ID_MODELLINGRULE_MANDATORY);
    const UA_NodeId hasModellingRuleId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASMODELLINGRULE);

    /* Get the child */
    const UA_Node *child = UA_NodeStore_get(server->nodestore, childNodeId);
    if(!child)
        return false;

    /* Look for the reference making the child mandatory */
    for(size_t i = 0; i < child->referencesSize; ++i) {
        UA_ReferenceNode *ref = &child->references[i];
        if(!UA_NodeId_equal(&hasModellingRuleId, &ref->referenceTypeId))
            continue;
        if(!UA_NodeId_equal(&mandatoryId, &ref->targetId.nodeId))
            continue;
        if(ref->isInverse)
            continue;
        return true;
    }
    return false;
}